

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O2

void __thiscall Clasp::Cli::ClaspAppBase::handleStartOptions(ClaspAppBase *this,ClaspFacade *clasp)

{
  string *in;
  bool bVar1;
  char cVar2;
  int iVar3;
  BasicProgramAdapter *this_00;
  AspifInput *this_01;
  LitSpan *in_RCX;
  sockaddr *__addr;
  StreamType **this_02;
  AbstractProgram *out;
  SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject> prgTemp;
  Lit_t lit;
  LitSpan local_30;
  
  bVar1 = ClaspFacade::incremental(clasp);
  if (!bVar1) {
    ClaspCliConfig::releaseOptions(&this->claspConfig_);
  }
  if ((this->claspAppOpts_).compute != 0) {
    iVar3 = (**(code **)(*(long *)((clasp->builder_).ptr_ & 0xfffffffffffffffe) + 0x40))();
    if (iVar3 == 2) {
      lit = -(this->claspAppOpts_).compute;
      local_30.first = &lit;
      prgTemp.ptr_ = 0;
      in_RCX = &local_30;
      local_30.size = 1;
      Asp::LogicProgram::addRule
                ((LogicProgram *)((clasp->builder_).ptr_ & 0xfffffffffffffffe),(Head_t)0x0,
                 (AtomSpan *)&prgTemp,in_RCX);
    }
  }
  if ((this->claspAppOpts_).lemmaIn._M_string_length != 0) {
    prgTemp.ptr_ = 0;
    iVar3 = (**(code **)(*(long *)((clasp->builder_).ptr_ & 0xfffffffffffffffe) + 0x40))();
    if (iVar3 == 2) {
      this_00 = (BasicProgramAdapter *)operator_new(0x18);
      Asp::LogicProgramAdapter::LogicProgramAdapter
                ((LogicProgramAdapter *)this_00,
                 (LogicProgram *)((clasp->builder_).ptr_ & 0xfffffffffffffffe));
    }
    else {
      this_00 = (BasicProgramAdapter *)operator_new(0x38);
      BasicProgramAdapter::BasicProgramAdapter
                (this_00,(ProgramBuilder *)((clasp->builder_).ptr_ & 0xfffffffffffffffe));
    }
    SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject>::reset
              (&prgTemp,&this_00->super_AbstractProgram);
    this_01 = (AspifInput *)operator_new(0x240);
    out = (AbstractProgram *)(prgTemp.ptr_ & 0xfffffffffffffffe);
    prgTemp.ptr_ = (uintp)out;
    Potassco::AspifInput::AspifInput(this_01,out);
    (this_01->super_ProgramReader)._vptr_ProgramReader = (_func_int **)&PTR__LemmaIn_001e7090;
    this_01[1].super_ProgramReader._vptr_ProgramReader = (_func_int **)out;
    this_02 = &this_01[1].super_ProgramReader.str_;
    std::ifstream::ifstream(this_02);
    in = &(this->claspAppOpts_).lemmaIn;
    bVar1 = isStdIn(in);
    if (!bVar1) {
      std::ifstream::open((char *)this_02,(_Ios_Openmode)(in->_M_dataplus)._M_p);
    }
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      this_02 = (StreamType **)&std::cin;
    }
    iVar3 = Potassco::ProgramReader::accept
                      ((ProgramReader *)this_01,(int)this_02,__addr,(socklen_t *)in_RCX);
    if ((char)iVar3 == '\0') {
      Potassco::fail(-2,
                     "Clasp::Cli::ClaspAppBase::handleStartOptions(ClaspFacade &)::LemmaIn::LemmaIn(const std::string &, PrgAdapter *)"
                     ,0x1e4,"accept(getStream())","\'lemma-in\': invalid input file!",0);
    }
    SingleOwnerPtr<Potassco::ProgramReader,_Clasp::DeleteObject>::reset
              (&this->lemmaIn_,(ProgramReader *)this_01);
    SingleOwnerPtr<Potassco::AbstractProgram,_Clasp::DeleteObject>::~SingleOwnerPtr(&prgTemp);
  }
  return;
}

Assistant:

void ClaspAppBase::handleStartOptions(ClaspFacade& clasp) {
	if (!clasp.incremental()) {
		claspConfig_.releaseOptions();
	}
	if (claspAppOpts_.compute && clasp.program()->type() == Problem_t::Asp) {
		Potassco::Lit_t lit = Potassco::neg(claspAppOpts_.compute);
		static_cast<Asp::LogicProgram*>(clasp.program())->addRule(Potassco::Head_t::Disjunctive, Potassco::toSpan<Potassco::Atom_t>(), Potassco::toSpan(&lit, 1));
	}
	if (!claspAppOpts_.lemmaIn.empty()) {
		class LemmaIn : public Potassco::AspifInput {
		public:
			typedef Potassco::AbstractProgram PrgAdapter;
			LemmaIn(const std::string& fn, PrgAdapter* prg) : Potassco::AspifInput(*prg), prg_(prg) {
				if (!isStdIn(fn)) { file_.open(fn.c_str()); }
				POTASSCO_REQUIRE(accept(getStream()), "'lemma-in': invalid input file!");
			}
			~LemmaIn() { delete prg_; }
		private:
			std::istream& getStream() { return file_.is_open() ? file_ : std::cin; }
			PrgAdapter*   prg_;
			std::ifstream file_;
		};
		SingleOwnerPtr<Potassco::AbstractProgram> prgTemp;
		if (clasp.program()->type() == Problem_t::Asp) { prgTemp = new Asp::LogicProgramAdapter(*static_cast<Asp::LogicProgram*>(clasp.program())); }
		else { prgTemp = new BasicProgramAdapter(*clasp.program()); }
		lemmaIn_ = new LemmaIn(claspAppOpts_.lemmaIn, prgTemp.release());
	}
}